

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O2

void Assimp::ExportScenePlyBinary
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar3;
  DeadlyImportError *this;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  PlyExporter exporter;
  long *plVar2;
  
  PlyExporter::PlyExporter(&exporter,pFile,pScene,true);
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    uVar3 = std::ostream::tellp();
    (**(code **)(*plVar2 + 0x18))(plVar2,local_210._M_dataplus._M_p,uVar3,1);
    std::__cxx11::string::~string((string *)&local_210);
    (**(code **)(*plVar2 + 8))(plVar2);
    PlyExporter::~PlyExporter(&exporter);
    return;
  }
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pFile,&local_211);
  std::operator+(&local_210,"could not open output .ply file: ",&local_1f0);
  DeadlyImportError::DeadlyImportError(this,&local_210);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportScenePlyBinary(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    // invoke the exporter
    PlyExporter exporter(pFile, pScene, true);

    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile(pIOSystem->Open(pFile, "wb"));
    if (outfile == NULL) {
        throw DeadlyExportError("could not open output .ply file: " + std::string(pFile));
    }

    outfile->Write(exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()), 1);
}